

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O2

void PPrintAttribute(TidyDocImpl *doc,uint indent,Node *node,AttVal *attr)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  TidyAttrId TVar4;
  Bool BVar5;
  uint uVar6;
  Bool BVar7;
  Node *pNVar8;
  tmbstr value;
  int iVar9;
  tmbstr *pptVar10;
  byte *attrname;
  bool bVar11;
  uint local_6c;
  tchar c;
  int local_5c;
  AttVal *local_58;
  Node *local_50;
  int local_44;
  ulong local_40;
  ulong local_38;
  
  local_40 = (ulong)*(uint *)((doc->config).value + 100);
  local_38 = (ulong)*(uint *)((doc->config).value + 0x62);
  local_5c = *(int *)((doc->config).value + 0x5b);
  iVar2 = *(int *)((doc->config).value + 0x54);
  iVar3 = *(int *)((doc->config).value + 0x23);
  iVar9 = *(int *)((doc->config).value + 0x26);
  local_50 = node;
  if (node->element != (tmbstr)0x0) {
    pptVar10 = &node->element;
    BVar5 = prvTidynodeHasCM(node,0x10);
    if (BVar5 != no) {
      pNVar8 = node->parent;
      if (node->parent == (Node *)0x0) {
        pNVar8 = node;
      }
      BVar5 = ShouldIndent(doc,pNVar8);
      node = local_50;
      if (BVar5 != no) {
        pNVar8 = prvTidyFindContainer(local_50);
        if (pNVar8 == (Node *)0x0) goto LAB_0014a720;
        pptVar10 = &pNVar8->element;
      }
    }
    uVar6 = prvTidytmbstrlen(*pptVar10);
    iVar9 = uVar6 + 2;
    node = local_50;
  }
LAB_0014a720:
  local_58 = node->attributes;
  attrname = (byte *)attr->attribute;
  local_6c = indent;
  if (iVar3 == 0) {
    local_44 = 0;
  }
  else {
    bVar11 = local_58 != attr;
    local_44 = iVar9;
    BVar5 = prvTidynodeIsElement(node);
    if (BVar5 != no && bVar11) {
      local_6c = indent + iVar9;
      PCondFlushLineSmart(doc,local_6c);
    }
  }
  BVar5 = no;
  BVar7 = no;
  CheckWrapIndent(doc,local_6c);
  if ((local_38 == 0 && local_40 == 0) && (attr->dict != (Attribute *)0x0)) {
    BVar5 = prvTidyIsScript(doc,(ctmbstr)attrname);
    if (BVar5 == no) {
      BVar5 = BVar7;
      if (attr->dict == (Attribute *)0x0) {
        if (local_5c == 0) goto LAB_0014a7ba;
      }
      else {
        TVar4 = attr->dict->id;
        if ((((TVar4 == TidyAttr_ALT) || (TVar4 == TidyAttr_CONTENT)) || (TVar4 == TidyAttr_VALUE))
           || (TVar4 == TidyAttr_TITLE || local_5c == 0)) goto LAB_0014a7ba;
      }
      BVar5 = yes;
    }
    else {
      BVar5 = *(Bool *)((doc->config).value + 0x5f);
    }
  }
LAB_0014a7ba:
  if ((local_58 == attr) || (BVar7 = SetWrap(doc,local_6c), BVar7 != no)) {
    if ((doc->pprint).linelen != 0) {
      AddChar(&doc->pprint,0x20);
    }
  }
  else {
    prvTidyPFlushLine(doc,local_44 + local_6c);
  }
  for (; bVar1 = *attrname, bVar1 != 0; attrname = attrname + 1) {
    c = (tchar)bVar1;
    if ((char)bVar1 < '\0') {
      uVar6 = prvTidyGetUTF8((ctmbstr)attrname,&c);
      attrname = attrname + uVar6;
    }
    else if (iVar2 == 1) {
      c = prvTidyToUpper(c);
    }
    AddChar(&doc->pprint,c);
  }
  CheckWrapIndent(doc,local_6c);
  value = attr->value;
  if (value == (tmbstr)0x0) {
    BVar5 = prvTidyIsBoolAttribute(attr);
    BVar7 = prvTidyattrIsEvent(attr);
    if (local_40 == 0) {
      if ((BVar5 != no) || (BVar5 = prvTidyIsNewNode(local_50), BVar5 != no)) {
        SetWrap(doc,local_6c);
        return;
      }
      uVar6 = attr->delim;
      value = "";
      BVar5 = yes;
    }
    else {
      if (BVar5 == no) {
        value = "";
      }
      else {
        value = attr->attribute;
      }
      uVar6 = attr->delim;
      BVar5 = no;
    }
  }
  else {
    uVar6 = attr->delim;
    BVar7 = no;
  }
  PPrintAttrValue(doc,local_6c,value,uVar6,BVar5,BVar7);
  return;
}

Assistant:

static void PPrintAttribute( TidyDocImpl* doc, uint indent,
                             Node *node, AttVal *attr )
{
    TidyPrintImpl* pprint = &doc->pprint;
    Bool xmlOut    = cfgBool( doc, TidyXmlOut );
    Bool xhtmlOut  = cfgBool( doc, TidyXhtmlOut );
    Bool wrapAttrs = cfgBool( doc, TidyWrapAttVals );
    uint ucAttrs   = cfg( doc, TidyUpperCaseAttrs );
    Bool indAttrs  = cfgBool( doc, TidyIndentAttributes );
    uint xtra      = AttrIndent( doc, node, attr );
    Bool first     = AttrNoIndentFirst( /*doc,*/ node, attr );
    tmbstr name    = attr->attribute;
    Bool wrappable = no;
    tchar c;

    /* fix for odd attribute indentation bug triggered by long values */
    if (!indAttrs)
      xtra = 0;

    if ( indAttrs )
    {
        if ( TY_(nodeIsElement)(node) && !first )
        {
            indent += xtra;
            PCondFlushLineSmart( doc, indent );
        }
        else
          indAttrs = no;
    }

    CheckWrapIndent( doc, indent );

    if ( !xmlOut && !xhtmlOut && attr->dict )
    {
        if ( TY_(IsScript)(doc, name) )
            wrappable = cfgBool( doc, TidyWrapScriptlets );
        else if (!(attrIsCONTENT(attr) || attrIsVALUE(attr) || attrIsALT(attr) || attrIsTITLE(attr)) && wrapAttrs )
            wrappable = yes;
    }

    if ( !first && !SetWrap(doc, indent) )
    {
        TY_(PFlushLine)( doc, indent+xtra );  /* Put it on next line */
    }
    else if ( pprint->linelen > 0 )
    {
        AddChar( pprint, ' ' );
    }

    /* Attribute name */
    while (*name)
    {
        c = (unsigned char)*name;

        if (c > 0x7F)
            name += TY_(GetUTF8)(name, &c);
        else if (ucAttrs == TidyUppercaseYes)
            c = TY_(ToUpper)(c);

        AddChar(pprint, c);
        ++name;
    }

    CheckWrapIndent( doc, indent );
 
    if ( attr->value == NULL )
    {
        Bool isB = TY_(IsBoolAttribute)(attr);
        Bool scriptAttr = TY_(attrIsEvent)(attr);

        if ( xmlOut )
            PPrintAttrValue( doc, indent, isB ? attr->attribute : NULLSTR,
                             attr->delim, no, scriptAttr );

        else if ( !isB && !TY_(IsNewNode)(node) )
            PPrintAttrValue( doc, indent, "", attr->delim, yes, scriptAttr );

        else 
            SetWrap( doc, indent );
    }
    else
        PPrintAttrValue( doc, indent, attr->value, attr->delim, wrappable, no );
}